

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

int xhtmlIsEmpty(xmlNodePtr node)

{
  xmlChar xVar1;
  int iVar2;
  uint uVar3;
  char *str2;
  xmlChar *str1;
  
  if (node == (xmlNodePtr)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = 0;
    if ((node->type == XML_ELEMENT_NODE) &&
       (((node->ns == (xmlNs *)0x0 ||
         (iVar2 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/1999/xhtml"), iVar2 != 0)
         ) && (node->children == (_xmlNode *)0x0)))) {
      str1 = node->name;
      uVar3 = 0;
      if (str1 == (xmlChar *)0x0) {
        xVar1 = '\0';
      }
      else {
        xVar1 = *str1;
      }
      switch(xVar1) {
      case 'a':
        str2 = "area";
        break;
      case 'b':
        iVar2 = xmlStrEqual(str1,"br");
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = xmlStrEqual(node->name,"base");
        if (iVar2 != 0) {
          return 1;
        }
        str1 = node->name;
        str2 = "basefont";
        break;
      case 'c':
        str2 = "col";
        break;
      default:
        goto switchD_001713c0_caseD_64;
      case 'f':
        str2 = "frame";
        break;
      case 'h':
        str2 = "hr";
        break;
      case 'i':
        iVar2 = xmlStrEqual(str1,(xmlChar *)"img");
        if (iVar2 != 0) {
          return 1;
        }
        iVar2 = xmlStrEqual(node->name,"input");
        if (iVar2 != 0) {
          return 1;
        }
        str1 = node->name;
        str2 = "isindex";
        break;
      case 'l':
        str2 = "link";
        break;
      case 'm':
        str2 = "meta";
        break;
      case 'p':
        str2 = "param";
      }
      iVar2 = xmlStrEqual(str1,(xmlChar *)str2);
      uVar3 = (uint)(iVar2 != 0);
    }
  }
switchD_001713c0_caseD_64:
  return uVar3;
}

Assistant:

static int
xhtmlIsEmpty(xmlNodePtr node) {
    if (node == NULL)
	return(-1);
    if (node->type != XML_ELEMENT_NODE)
	return(0);
    if ((node->ns != NULL) && (!xmlStrEqual(node->ns->href, XHTML_NS_NAME)))
	return(0);
    if (node->children != NULL)
	return(0);
    switch (node->name ? node->name[0] : 0) {
	case 'a':
	    if (xmlStrEqual(node->name, BAD_CAST "area"))
		return(1);
	    return(0);
	case 'b':
	    if (xmlStrEqual(node->name, BAD_CAST "br"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "base"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "basefont"))
		return(1);
	    return(0);
	case 'c':
	    if (xmlStrEqual(node->name, BAD_CAST "col"))
		return(1);
	    return(0);
	case 'f':
	    if (xmlStrEqual(node->name, BAD_CAST "frame"))
		return(1);
	    return(0);
	case 'h':
	    if (xmlStrEqual(node->name, BAD_CAST "hr"))
		return(1);
	    return(0);
	case 'i':
	    if (xmlStrEqual(node->name, BAD_CAST "img"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "input"))
		return(1);
	    if (xmlStrEqual(node->name, BAD_CAST "isindex"))
		return(1);
	    return(0);
	case 'l':
	    if (xmlStrEqual(node->name, BAD_CAST "link"))
		return(1);
	    return(0);
	case 'm':
	    if (xmlStrEqual(node->name, BAD_CAST "meta"))
		return(1);
	    return(0);
	case 'p':
	    if (xmlStrEqual(node->name, BAD_CAST "param"))
		return(1);
	    return(0);
    }
    return(0);
}